

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O2

void Wlc_NtkPrintInputInfo(Wlc_Ntk_t *pNtk)

{
  int iVar1;
  FILE *__stream;
  Wlc_Obj_t *pWVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  __stream = fopen("abc_blast_input.info","w");
  uVar5 = 0;
  for (iVar7 = 0; iVar7 < (pNtk->vCis).nSize; iVar7 = iVar7 + 1) {
    pWVar2 = Wlc_NtkCi(pNtk,iVar7);
    uVar9 = pWVar2->End;
    uVar8 = pWVar2->Beg;
    iVar4 = uVar9 - uVar8;
    if ((int)uVar9 < (int)uVar8) {
      uVar8 = uVar9;
    }
    iVar1 = -iVar4;
    if (0 < iVar4) {
      iVar1 = iVar4;
    }
    uVar11 = (ulong)uVar5;
    uVar9 = iVar1 + 1;
    uVar10 = (ulong)uVar9;
    while( true ) {
      bVar12 = uVar10 == 0;
      uVar10 = uVar10 - 1;
      if (bVar12) break;
      uVar6 = 0x69;
      if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x3) {
        uVar6 = (uint)pNtk->pInits[uVar11];
      }
      pcVar3 = Wlc_ObjName(pNtk,(int)(((long)pWVar2 - (long)pNtk->pObjs) / 0x18));
      fprintf(__stream,"%s[%d] : %c \n",pcVar3,(ulong)uVar8,(ulong)uVar6);
      uVar8 = uVar8 + 1;
      uVar11 = uVar11 + 1;
    }
    if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x3) {
      uVar9 = 0;
    }
    uVar5 = uVar9 + uVar5;
  }
  for (iVar7 = 0; iVar7 < (pNtk->vPos).nSize; iVar7 = iVar7 + 1) {
    iVar4 = Vec_IntEntry(&pNtk->vPos,iVar7);
    pWVar2 = Wlc_NtkObj(pNtk,iVar4);
    iVar4 = pWVar2->End;
    iVar1 = pWVar2->Beg;
    uVar5 = iVar4 - iVar1;
    if (iVar4 < iVar1) {
      iVar1 = iVar4;
    }
    uVar9 = -uVar5;
    if (0 < (int)uVar5) {
      uVar9 = uVar5;
    }
    for (uVar5 = 0; uVar5 <= uVar9; uVar5 = uVar5 + 1) {
      pcVar3 = Wlc_ObjName(pNtk,(int)(((long)pWVar2 - (long)pNtk->pObjs) / 0x18));
      fprintf(__stream,"%s[%d] : o \n",pcVar3,(ulong)(iVar1 + uVar5));
    }
  }
  fclose(__stream);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkPrintInputInfo( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj;
    int i, k, nRange, nBeg, nEnd, nBits = 0;
    FILE * output;

    output = fopen("abc_blast_input.info","w");

    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        nRange = Wlc_ObjRange(pObj);
        nBeg = pObj->Beg;
        nEnd = pObj->End;

        for ( k = 0; k < nRange; k++ )
        {
            int index = nEnd > nBeg ? nBeg + k : nEnd + k;
            char c = pObj->Type != WLC_OBJ_FO ? 'i' : pNtk->pInits[nBits + k];
            fprintf(output,"%s[%d] : %c \n", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), index , c );
        }
        if (pObj->Type == WLC_OBJ_FO)
            nBits += nRange;
    }

    Wlc_NtkForEachPo( pNtk, pObj, i )
    {
        nRange = Wlc_ObjRange(pObj);
        nBeg = pObj->Beg;
        nEnd = pObj->End;

        for ( k = 0; k < nRange; k++ )
        {
            int index = nEnd > nBeg ? nBeg + k : nEnd + k;
            fprintf(output,"%s[%d] : o \n", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), index);
        }
    }

    fclose(output);
    return;
}